

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__do_zlib(stbi__zbuf *a,char *obuf,int olen,int exp,int parse_header)

{
  stbi__zhuffman *z;
  uint uVar1;
  stbi_uc *psVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  byte bVar7;
  ushort uVar8;
  uint uVar9;
  uint uVar10;
  int iVar11;
  byte *pbVar12;
  long lVar13;
  stbi_uc *psVar14;
  int iVar15;
  stbi_uc sVar16;
  ulong uVar17;
  long lVar18;
  stbi__uint32 sVar19;
  stbi__uint32 sVar20;
  uint uVar21;
  char *pcVar22;
  ulong uVar23;
  stbi_uc lencodes [455];
  stbi__zhuffman z_codelength;
  undefined8 local_a08;
  undefined7 uStack_a00;
  undefined4 uStack_9f9;
  byte bStack_9e9;
  stbi_uc local_9e8 [468];
  stbi__zhuffman local_814;
  
  a->zout_start = obuf;
  a->zout = obuf;
  a->zout_end = obuf + olen;
  a->z_expandable = exp;
  if (parse_header == 0) {
LAB_0015f942:
    a->num_bits = 0;
    a->code_buffer = 0;
    z = &a->z_distance;
    iVar11 = 0;
    do {
      if (iVar11 < 1) {
        stbi__fill_bits(a);
        iVar11 = a->num_bits;
      }
      uVar1 = a->code_buffer;
      sVar19 = uVar1 >> 1;
      a->code_buffer = sVar19;
      iVar4 = iVar11 + -1;
      a->num_bits = iVar4;
      if (iVar11 < 3) {
        stbi__fill_bits(a);
        iVar4 = a->num_bits;
        sVar19 = a->code_buffer;
      }
      sVar20 = sVar19 >> 2;
      a->code_buffer = sVar20;
      uVar3 = iVar4 - 2;
      a->num_bits = uVar3;
      switch(sVar19 & 3) {
      case 0:
        uVar9 = uVar3 & 7;
        if (uVar9 != 0) {
          if (iVar4 < 2) {
            stbi__fill_bits(a);
            uVar3 = a->num_bits;
            sVar20 = a->code_buffer;
          }
          sVar20 = sVar20 >> (sbyte)uVar9;
          a->code_buffer = sVar20;
          uVar3 = uVar3 - uVar9;
          a->num_bits = uVar3;
        }
        if ((int)uVar3 < 1) {
          if (uVar3 != 0) goto LAB_00160242;
          uVar23 = 0;
LAB_0016011c:
          psVar14 = a->zbuffer;
          psVar2 = a->zbuffer_end;
          do {
            if (psVar14 < psVar2) {
              a->zbuffer = psVar14 + 1;
              sVar16 = *psVar14;
              psVar14 = psVar14 + 1;
            }
            else {
              sVar16 = '\0';
            }
            *(stbi_uc *)((long)local_814.fast + uVar23) = sVar16;
            uVar23 = uVar23 + 1;
          } while (uVar23 != 4);
        }
        else {
          uVar9 = uVar3 - 1 >> 3;
          uVar23 = (ulong)(uVar9 + 1);
          uVar17 = 0xffffffffffffffff;
          do {
            *(char *)((long)local_814.fast + uVar17 + 1) = (char)sVar20;
            sVar20 = sVar20 >> 8;
            uVar17 = uVar17 + 1;
          } while (uVar9 != uVar17);
          a->code_buffer = sVar20;
          iVar11 = (uVar3 - 8) - (uVar3 - 1 & 0xfffffff8);
          a->num_bits = iVar11;
          if (iVar11 != 0) {
LAB_00160242:
            __assert_fail("a->num_bits == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/stb/stb_image.h"
                          ,0x1035,"int stbi__parse_uncompressed_block(stbi__zbuf *)");
          }
          if (uVar17 < 3) goto LAB_0016011c;
        }
        if ((local_814.fast[1] ^ local_814.fast[0]) != 0xffff) {
          stbi__g_failure_reason = "zlib corrupt";
          return 0;
        }
        psVar14 = a->zbuffer;
        uVar23 = (ulong)local_814.fast[0];
        if (a->zbuffer_end < psVar14 + uVar23) {
          stbi__g_failure_reason = "read past buffer";
          return 0;
        }
        pcVar22 = a->zout;
        if (a->zout_end < pcVar22 + uVar23) {
          iVar11 = stbi__zexpand(a,pcVar22,(uint)local_814.fast[0]);
          if (iVar11 == 0) {
            return 0;
          }
          psVar14 = a->zbuffer;
          pcVar22 = a->zout;
        }
        memcpy(pcVar22,psVar14,uVar23);
        a->zbuffer = a->zbuffer + uVar23;
        a->zout = a->zout + uVar23;
        goto LAB_001601b7;
      case 1:
        iVar11 = stbi__zbuild_huffman
                           (&a->z_length,
                            "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\t\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\a\b\b\b\b\b\b\b\b"
                            ,0x120);
        if (iVar11 == 0) {
          return 0;
        }
        iVar11 = stbi__zbuild_huffman
                           (z,
                            "\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05\x05"
                            ,0x20);
        break;
      case 2:
        if (iVar4 < 7) {
          stbi__fill_bits(a);
          uVar3 = a->num_bits;
          sVar20 = a->code_buffer;
        }
        sVar19 = sVar20 >> 5;
        a->code_buffer = sVar19;
        iVar11 = uVar3 - 5;
        a->num_bits = iVar11;
        if ((int)uVar3 < 10) {
          stbi__fill_bits(a);
          iVar11 = a->num_bits;
          sVar19 = a->code_buffer;
        }
        uVar3 = sVar19 >> 5;
        a->code_buffer = uVar3;
        iVar4 = iVar11 + -5;
        a->num_bits = iVar4;
        if (iVar11 < 9) {
          stbi__fill_bits(a);
          iVar4 = a->num_bits;
          uVar3 = a->code_buffer;
        }
        uVar21 = (sVar20 & 0x1f) + 0x101;
        iVar11 = (sVar19 & 0x1f) + 1;
        uVar9 = uVar3 >> 4;
        a->code_buffer = uVar9;
        iVar4 = iVar4 + -4;
        a->num_bits = iVar4;
        local_a08 = 0;
        uStack_a00 = 0;
        uStack_9f9 = 0;
        uVar23 = 0;
        do {
          uVar10 = uVar9;
          if (iVar4 < 3) {
            stbi__fill_bits(a);
            iVar4 = a->num_bits;
            uVar10 = a->code_buffer;
          }
          uVar9 = uVar10 >> 3;
          a->code_buffer = uVar9;
          iVar4 = iVar4 + -3;
          a->num_bits = iVar4;
          *(byte *)((long)&local_a08 +
                   (ulong)(byte)(&stbi__compute_huffman_codes(stbi__zbuf*)::length_dezigzag)[uVar23]
                   ) = (byte)uVar10 & 7;
          uVar23 = uVar23 + 1;
        } while ((uVar3 & 0xf) + 4 != uVar23);
        iVar4 = stbi__zbuild_huffman(&local_814,(stbi_uc *)&local_a08,0x13);
        if (iVar4 == 0) {
          return 0;
        }
        iVar5 = iVar11 + uVar21;
        iVar4 = a->num_bits;
        iVar15 = 0;
        do {
          if (iVar4 < 0x10) {
            stbi__fill_bits(a);
          }
          uVar3 = a->code_buffer;
          uVar8 = local_814.fast[uVar3 & 0x1ff];
          if (uVar8 == 0) {
            uVar8 = (ushort)uVar3 << 8 | (ushort)uVar3 >> 8;
            uVar9 = (uVar8 & 0xf0f) << 4 | (uVar8 & 0xf0f0) >> 4;
            uVar9 = (uVar9 >> 2 & 0x3333) + (uVar9 & 0x3333) * 4;
            uVar9 = (uVar9 >> 1 & 0x5555) + (uVar9 & 0x5555) * 2;
            lVar6 = 0;
            do {
              lVar13 = lVar6;
              lVar6 = lVar13 + 1;
            } while (local_814.maxcode[lVar13 + 10] <= (int)uVar9);
            if (lVar6 == 7) goto LAB_001601c6;
            lVar18 = (ulong)local_814.firstsymbol[lVar13 + 10] +
                     ((ulong)(uVar9 >> (7U - (char)lVar6 & 0x1f)) -
                     (ulong)local_814.firstcode[lVar13 + 10]);
            if ((ulong)*(byte *)((long)&local_814 + lVar18 + 0x484) - 9 != lVar6) goto LAB_00160223;
            uVar3 = uVar3 >> ((char)lVar13 + 10U & 0x1f);
            a->code_buffer = uVar3;
            iVar4 = (a->num_bits - (int)lVar6) + -9;
            a->num_bits = iVar4;
            uVar8 = *(ushort *)((long)&local_814 + lVar18 * 2 + 0x5a4);
          }
          else {
            uVar3 = uVar3 >> ((byte)(uVar8 >> 9) & 0x1f);
            a->code_buffer = uVar3;
            iVar4 = a->num_bits - (uint)(uVar8 >> 9);
            a->num_bits = iVar4;
            uVar8 = uVar8 & 0x1ff;
          }
          if (0x12 < uVar8) goto LAB_001601c6;
          if (uVar8 < 0x10) {
            lVar6 = (long)iVar15;
            iVar15 = iVar15 + 1;
            local_9e8[lVar6] = (char)uVar8;
          }
          else {
            if (uVar8 == 0x11) {
              if (iVar4 < 3) {
                stbi__fill_bits(a);
                iVar4 = a->num_bits;
                uVar3 = a->code_buffer;
              }
              a->code_buffer = uVar3 >> 3;
              iVar4 = iVar4 + -3;
              a->num_bits = iVar4;
              uVar3 = (uVar3 & 7) + 3;
LAB_0015fd45:
              bVar7 = 0;
            }
            else {
              if (uVar8 != 0x10) {
                if (iVar4 < 7) {
                  stbi__fill_bits(a);
                  iVar4 = a->num_bits;
                  uVar3 = a->code_buffer;
                }
                a->code_buffer = uVar3 >> 7;
                iVar4 = iVar4 + -7;
                a->num_bits = iVar4;
                uVar3 = (uVar3 & 0x7f) + 0xb;
                goto LAB_0015fd45;
              }
              if (iVar4 < 2) {
                stbi__fill_bits(a);
                iVar4 = a->num_bits;
                uVar3 = a->code_buffer;
              }
              a->code_buffer = uVar3 >> 2;
              iVar4 = iVar4 + -2;
              a->num_bits = iVar4;
              if (iVar15 == 0) goto LAB_001601c6;
              uVar3 = (uVar3 & 3) + 3;
              bVar7 = (&bStack_9e9)[iVar15];
            }
            if (iVar5 - iVar15 < (int)uVar3) goto LAB_001601c6;
            memset(local_9e8 + iVar15,(uint)bVar7,(ulong)uVar3);
            iVar15 = iVar15 + uVar3;
          }
        } while (iVar15 < iVar5);
        if (iVar15 != iVar5) {
LAB_001601c6:
          stbi__g_failure_reason = "bad codelengths";
          return 0;
        }
        iVar4 = stbi__zbuild_huffman(&a->z_length,local_9e8,uVar21);
        if (iVar4 == 0) {
          return 0;
        }
        iVar11 = stbi__zbuild_huffman(z,local_9e8 + uVar21,iVar11);
        break;
      case 3:
        goto switchD_0015f9cb_caseD_3;
      }
      if (iVar11 == 0) {
        return 0;
      }
      pcVar22 = a->zout;
      while( true ) {
        while( true ) {
          if (a->num_bits < 0x10) {
            stbi__fill_bits(a);
          }
          uVar3 = a->code_buffer;
          uVar8 = (a->z_length).fast[uVar3 & 0x1ff];
          if (uVar8 == 0) {
            uVar8 = (ushort)uVar3 << 8 | (ushort)uVar3 >> 8;
            uVar9 = (uVar8 & 0xf0f) << 4 | (uVar8 & 0xf0f0) >> 4;
            uVar9 = (uVar9 >> 2 & 0x3333) + (uVar9 & 0x3333) * 4;
            uVar9 = (uVar9 >> 1 & 0x5555) + (uVar9 & 0x5555) * 2;
            lVar6 = 0;
            do {
              lVar13 = lVar6;
              lVar6 = lVar13 + 1;
            } while ((a->z_length).maxcode[lVar13 + 10] <= (int)uVar9);
            if (lVar6 == 7) goto LAB_001601d8;
            lVar18 = (ulong)(a->z_length).firstsymbol[lVar13 + 10] +
                     ((ulong)(uVar9 >> (7U - (char)lVar6 & 0x1f)) -
                     (ulong)(a->z_length).firstcode[lVar13 + 10]);
            if ((ulong)*(byte *)((long)a + lVar18 + 0x4b8) - 9 != lVar6) goto LAB_00160223;
            uVar3 = uVar3 >> ((char)lVar13 + 10U & 0x1f);
            a->code_buffer = uVar3;
            iVar11 = (a->num_bits - (int)lVar6) + -9;
            a->num_bits = iVar11;
            uVar9 = (uint)*(ushort *)((long)a + lVar18 * 2 + 0x5d8);
          }
          else {
            uVar3 = uVar3 >> ((byte)(uVar8 >> 9) & 0x1f);
            a->code_buffer = uVar3;
            iVar11 = a->num_bits - (uint)(uVar8 >> 9);
            a->num_bits = iVar11;
            uVar9 = uVar8 & 0x1ff;
          }
          if (0xff < uVar9) break;
          if (a->zout_end <= pcVar22) {
            iVar11 = stbi__zexpand(a,pcVar22,1);
            if (iVar11 == 0) {
              return 0;
            }
            pcVar22 = a->zout;
          }
          *pcVar22 = (char)uVar9;
          pcVar22 = pcVar22 + 1;
        }
        if (uVar9 == 0x100) break;
        uVar23 = (ulong)(uVar9 - 0x101);
        uVar9 = stbi__zlength_base[uVar23];
        if (0xffffffffffffffeb < uVar23 - 0x1c) {
          iVar4 = stbi__zlength_extra[uVar23];
          if (iVar11 < iVar4) {
            stbi__fill_bits(a);
            iVar11 = a->num_bits;
            uVar3 = a->code_buffer;
          }
          uVar21 = ~(-1 << ((byte)iVar4 & 0x1f)) & uVar3;
          uVar3 = uVar3 >> ((byte)iVar4 & 0x1f);
          a->code_buffer = uVar3;
          iVar11 = iVar11 - iVar4;
          a->num_bits = iVar11;
          uVar9 = uVar9 + uVar21;
        }
        if (iVar11 < 0x10) {
          stbi__fill_bits(a);
          uVar3 = a->code_buffer;
        }
        uVar8 = z->fast[uVar3 & 0x1ff];
        if (uVar8 == 0) {
          uVar8 = (ushort)uVar3 << 8 | (ushort)uVar3 >> 8;
          uVar21 = (uVar8 & 0xf0f) << 4 | (uVar8 & 0xf0f0) >> 4;
          uVar21 = (uVar21 >> 2 & 0x3333) + (uVar21 & 0x3333) * 4;
          uVar21 = (uVar21 >> 1 & 0x5555) + (uVar21 & 0x5555) * 2;
          lVar6 = 0;
          do {
            lVar13 = lVar6;
            lVar6 = lVar13 + 1;
          } while ((a->z_distance).maxcode[lVar13 + 10] <= (int)uVar21);
          if (lVar6 == 7) {
LAB_001601d8:
            stbi__g_failure_reason = "bad huffman code";
            return 0;
          }
          lVar18 = (ulong)(a->z_distance).firstsymbol[lVar13 + 10] +
                   ((ulong)(uVar21 >> (7U - (char)lVar6 & 0x1f)) -
                   (ulong)(a->z_distance).firstcode[lVar13 + 10]);
          if ((ulong)*(byte *)((long)a + lVar18 + 0xc9c) - 9 != lVar6) {
LAB_00160223:
            __assert_fail("z->size[b] == s",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/stb/stb_image.h"
                          ,0xf98,
                          "int stbi__zhuffman_decode_slowpath(stbi__zbuf *, stbi__zhuffman *)");
          }
          uVar3 = uVar3 >> ((char)lVar13 + 10U & 0x1f);
          a->code_buffer = uVar3;
          iVar11 = (a->num_bits - (int)lVar6) + -9;
          a->num_bits = iVar11;
          uVar21 = (uint)*(ushort *)((long)a + lVar18 * 2 + 0xdbc);
        }
        else {
          uVar3 = uVar3 >> ((byte)(uVar8 >> 9) & 0x1f);
          a->code_buffer = uVar3;
          iVar11 = a->num_bits - (uint)(uVar8 >> 9);
          a->num_bits = iVar11;
          uVar21 = uVar8 & 0x1ff;
        }
        uVar23 = (ulong)uVar21;
        iVar4 = stbi__zdist_base[uVar23];
        if (0xffffffffffffffe5 < uVar23 - 0x1e) {
          iVar5 = stbi__zdist_extra[uVar23];
          if (iVar11 < iVar5) {
            stbi__fill_bits(a);
            iVar11 = a->num_bits;
            uVar3 = a->code_buffer;
          }
          a->code_buffer = uVar3 >> ((byte)iVar5 & 0x1f);
          a->num_bits = iVar11 - iVar5;
          iVar4 = iVar4 + (~(-1 << ((byte)iVar5 & 0x1f)) & uVar3);
        }
        if ((long)pcVar22 - (long)a->zout_start < (long)iVar4) {
          stbi__g_failure_reason = "bad dist";
          return 0;
        }
        if (a->zout_end < pcVar22 + (int)uVar9) {
          iVar11 = stbi__zexpand(a,pcVar22,uVar9);
          if (iVar11 == 0) {
            return 0;
          }
          pcVar22 = a->zout;
        }
        lVar6 = -(long)iVar4;
        if (iVar4 == 1) {
          if (uVar9 != 0) {
            memset(pcVar22,(uint)(byte)pcVar22[lVar6],(ulong)uVar9);
            pcVar22 = pcVar22 + (ulong)(uVar9 - 1) + 1;
          }
        }
        else {
          for (; uVar9 != 0; uVar9 = uVar9 - 1) {
            *pcVar22 = pcVar22[lVar6];
            pcVar22 = pcVar22 + 1;
          }
        }
      }
      a->zout = pcVar22;
LAB_001601b7:
      if ((uVar1 & 1) != 0) {
        return 1;
      }
      iVar11 = a->num_bits;
    } while( true );
  }
  pbVar12 = a->zbuffer;
  uVar8 = 0;
  if (pbVar12 < a->zbuffer_end) {
    a->zbuffer = pbVar12 + 1;
    bVar7 = *pbVar12;
    pbVar12 = pbVar12 + 1;
  }
  else {
    bVar7 = 0;
  }
  if (pbVar12 < a->zbuffer_end) {
    a->zbuffer = pbVar12 + 1;
    uVar8 = (ushort)*pbVar12;
  }
  if ((ushort)(((ushort)bVar7 << 8 | uVar8) * 0x7bdf) < 0x843) {
    if ((uVar8 & 0x20) == 0) {
      if ((bVar7 & 0xf) == 8) goto LAB_0015f942;
      stbi__g_failure_reason = "bad compression";
    }
    else {
      stbi__g_failure_reason = "no preset dict";
    }
  }
  else {
    stbi__g_failure_reason = "bad zlib header";
  }
switchD_0015f9cb_caseD_3:
  return 0;
}

Assistant:

static int stbi__do_zlib(stbi__zbuf *a, char *obuf, int olen, int exp, int parse_header)
{
   a->zout_start = obuf;
   a->zout       = obuf;
   a->zout_end   = obuf + olen;
   a->z_expandable = exp;

   return stbi__parse_zlib(a, parse_header);
}